

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O2

RGBA deqp::gles3::Functional::FboTestUtil::getToSRGBConversionThreshold
               (TextureFormat *src,TextureFormat *dst)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  IVec4 bits;
  
  tcu::getTextureFormatMantissaBitDepth((tcu *)&bits,src);
  if ((long)bits.m_data[0] < 0xd) {
    uVar4 = *(uint *)(getToSRGB8ConversionError(int)::errors + (long)bits.m_data[0] * 4);
  }
  else {
    uVar4 = 1;
  }
  uVar3 = 0x100;
  if ((long)bits.m_data[1] < 0xd) {
    uVar3 = *(int *)(getToSRGB8ConversionError(int)::errors + (long)bits.m_data[1] * 4) << 8;
  }
  uVar5 = 0x10000;
  if ((long)bits.m_data[2] < 0xd) {
    uVar5 = *(int *)(getToSRGB8ConversionError(int)::errors + (long)bits.m_data[2] * 4) << 0x10;
  }
  uVar2 = 0;
  if (dst->order == sRGBA) {
    iVar1 = calculateU8ConversionError(bits.m_data[3]);
    uVar2 = iVar1 << 0x18;
  }
  return (RGBA)(uVar3 | uVar4 | uVar5 | uVar2);
}

Assistant:

tcu::RGBA getToSRGBConversionThreshold (const tcu::TextureFormat& src, const tcu::TextureFormat& dst)
{
	// Only SRGB8 and SRGB8_ALPHA8 formats are supported.
	DE_ASSERT(dst.type == tcu::TextureFormat::UNORM_INT8 && tcu::isSRGB(dst));

	const tcu::IVec4	bits		= tcu::getTextureFormatMantissaBitDepth(src);
	const bool			dstHasAlpha	= dst.order == tcu::TextureFormat::sRGBA;

	return tcu::RGBA(getToSRGB8ConversionError(bits.x()),
					 getToSRGB8ConversionError(bits.y()),
					 getToSRGB8ConversionError(bits.z()),
					 dstHasAlpha ? calculateU8ConversionError(bits.w()) : 0);
}